

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::TextureFilterMinmaxUtils::calcPixelSumValue
          (TextureFilterMinmaxUtils *this,RenderContext *context,GLuint textureId,IVec2 *textureSize
          ,GLenum format,GLenum type)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  reference pvVar7;
  RGBA local_64;
  ulong uStack_60;
  RGBA rgba;
  size_t texel;
  GLuint sum;
  undefined1 local_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> textureData;
  GLenum type_local;
  GLenum format_local;
  IVec2 *textureSize_local;
  GLuint textureId_local;
  RenderContext *context_local;
  TextureFilterMinmaxUtils *this_local;
  
  textureData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = type;
  textureData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = format;
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&stack0xffffffffffffffb0,textureSize);
  getDataFromTexture((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,this,context,
                     textureId,(IVec2 *)&stack0xffffffffffffffb0,
                     textureData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                     (GLenum)textureData.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage);
  texel._4_4_ = 0;
  uStack_60 = 0;
  while( true ) {
    uVar1 = uStack_60;
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
    if (sVar6 <= uVar1) break;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,uStack_60);
    tcu::RGBA::RGBA(&local_64,*pvVar7);
    iVar2 = tcu::RGBA::getRed(&local_64);
    iVar3 = tcu::RGBA::getGreen(&local_64);
    iVar4 = tcu::RGBA::getBlue(&local_64);
    iVar5 = tcu::RGBA::getAlpha(&local_64);
    texel._4_4_ = iVar5 + texel._4_4_ + iVar2 + iVar3 + iVar4;
    uStack_60 = uStack_60 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  return texel._4_4_;
}

Assistant:

glw::GLuint TextureFilterMinmaxUtils::calcPixelSumValue(const glu::RenderContext& context, glw::GLuint textureId,
														tcu::IVec2 textureSize, glw::GLenum format, glw::GLenum type)
{
	std::vector<glw::GLuint> textureData = getDataFromTexture(context, textureId, textureSize, format, type);

	glw::GLuint sum = 0;

	for (size_t texel = 0; texel < textureData.size(); ++texel)
	{
		tcu::RGBA rgba(textureData[texel]);
		sum += rgba.getRed();
		sum += rgba.getGreen();
		sum += rgba.getBlue();
		sum += rgba.getAlpha();
	}

	return sum;
}